

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int ssl3_prf(uchar *secret,size_t slen,char *label,uchar *random,size_t rlen,uchar *dstbuf,
            size_t dlen)

{
  size_t __n;
  uchar padding [16];
  uchar sha1sum [20];
  mbedtls_md5_context md5;
  mbedtls_sha1_context sha1;
  
  mbedtls_md5_init(&md5);
  mbedtls_sha1_init(&sha1);
  for (__n = 1; __n - (dlen >> 4) != 1; __n = __n + 1) {
    memset(padding,(int)__n + 0x40,__n);
    mbedtls_sha1_starts(&sha1);
    mbedtls_sha1_update(&sha1,padding,__n);
    mbedtls_sha1_update(&sha1,secret,slen);
    mbedtls_sha1_update(&sha1,random,rlen);
    mbedtls_sha1_finish(&sha1,sha1sum);
    mbedtls_md5_starts(&md5);
    mbedtls_md5_update(&md5,secret,slen);
    mbedtls_md5_update(&md5,sha1sum,0x14);
    mbedtls_md5_finish(&md5,dstbuf);
    dstbuf = dstbuf + 0x10;
  }
  mbedtls_md5_free(&md5);
  mbedtls_sha1_free(&sha1);
  mbedtls_zeroize(padding,0x10);
  mbedtls_zeroize(sha1sum,0x14);
  return 0;
}

Assistant:

static int ssl3_prf( const unsigned char *secret, size_t slen,
                     const char *label,
                     const unsigned char *random, size_t rlen,
                     unsigned char *dstbuf, size_t dlen )
{
    size_t i;
    mbedtls_md5_context md5;
    mbedtls_sha1_context sha1;
    unsigned char padding[16];
    unsigned char sha1sum[20];
    ((void)label);

    mbedtls_md5_init(  &md5  );
    mbedtls_sha1_init( &sha1 );

    /*
     *  SSLv3:
     *    block =
     *      MD5( secret + SHA1( 'A'    + secret + random ) ) +
     *      MD5( secret + SHA1( 'BB'   + secret + random ) ) +
     *      MD5( secret + SHA1( 'CCC'  + secret + random ) ) +
     *      ...
     */
    for( i = 0; i < dlen / 16; i++ )
    {
        memset( padding, (unsigned char) ('A' + i), 1 + i );

        mbedtls_sha1_starts( &sha1 );
        mbedtls_sha1_update( &sha1, padding, 1 + i );
        mbedtls_sha1_update( &sha1, secret, slen );
        mbedtls_sha1_update( &sha1, random, rlen );
        mbedtls_sha1_finish( &sha1, sha1sum );

        mbedtls_md5_starts( &md5 );
        mbedtls_md5_update( &md5, secret, slen );
        mbedtls_md5_update( &md5, sha1sum, 20 );
        mbedtls_md5_finish( &md5, dstbuf + i * 16 );
    }

    mbedtls_md5_free(  &md5  );
    mbedtls_sha1_free( &sha1 );

    mbedtls_zeroize( padding, sizeof( padding ) );
    mbedtls_zeroize( sha1sum, sizeof( sha1sum ) );

    return( 0 );
}